

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

bool __thiscall
llbuild::buildsystem::BuildSystem::loadDescription(BuildSystem *this,StringRef mainFilename)

{
  bool bVar1;
  BuildSystem *this_local;
  StringRef mainFilename_local;
  
  bVar1 = anon_unknown.dwarf_145302::BuildSystemImpl::loadDescription
                    ((BuildSystemImpl *)this->impl,mainFilename);
  return bVar1;
}

Assistant:

bool BuildSystem::loadDescription(StringRef mainFilename) {
  return static_cast<BuildSystemImpl*>(impl)->loadDescription(mainFilename);
}